

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CriticalSectionsBuilder.cpp
# Opt level: O2

set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
* __thiscall
CriticalSectionsBuilder::correspondingUnlocks
          (set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
           *__return_storage_ptr__,CriticalSectionsBuilder *this,CallInst *lock)

{
  _Rb_tree_header *p_Var1;
  const_iterator cVar2;
  CallInst *local_18;
  
  if ((lock != (CallInst *)0x0) &&
     (local_18 = lock,
     cVar2 = std::
             _Rb_tree<const_llvm::CallInst_*,_std::pair<const_llvm::CallInst_*const,_CriticalSection_*>,_std::_Select1st<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>,_std::less<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>_>
             ::find(&(this->criticalSections_)._M_t,&local_18),
     (_Rb_tree_header *)cVar2._M_node !=
     &(this->criticalSections_)._M_t._M_impl.super__Rb_tree_header)) {
    CriticalSection::unlocks(__return_storage_ptr__,(CriticalSection *)cVar2._M_node[1]._M_parent);
    return __return_storage_ptr__;
  }
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  return __return_storage_ptr__;
}

Assistant:

std::set<const llvm::CallInst *> CriticalSectionsBuilder::correspondingUnlocks(
        const llvm::CallInst *lock) const {
    if (!lock) {
        return {};
    }
    auto iterator = criticalSections_.find(lock);
    if (iterator != criticalSections_.end()) {
        return iterator->second->unlocks();
    }
    return {};
}